

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<ProKey,ProKey>::emplace<ProKey_const&>(QHash<ProKey,_ProKey> *this,ProKey *key,ProKey *args)

{
  long lVar1;
  QHash<ProKey,_ProKey> *in_RDX;
  ProKey *in_RDI;
  long in_FS_OFFSET;
  piter pVar2;
  ProKey copy;
  ProKey *in_stack_ffffffffffffff78;
  ProKey *in_stack_ffffffffffffff90;
  ProKey *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey(in_RDI,in_stack_ffffffffffffff78);
  pVar2 = (piter)emplace<ProKey_const&>(in_RDX,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  ProKey::~ProKey((ProKey *)0x3027c7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }